

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

Int __thiscall ipx::Basis::Factorize(Basis *this)

{
  int iVar1;
  Model *pMVar2;
  pointer piVar3;
  pointer piVar4;
  iterator __position;
  bool bVar5;
  uint uVar6;
  ostream *poVar7;
  Int IVar8;
  size_type sVar9;
  size_type __n;
  double dVar10;
  vector<int,_std::allocator<int>_> end;
  Timer timer;
  vector<int,_std::allocator<int>_> begin;
  double local_70;
  vector<int,_std::allocator<int>_> local_68;
  Timer local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  pMVar2 = this->model_;
  iVar1 = pMVar2->num_rows_;
  __n = (size_type)iVar1;
  Timer::Timer(&local_50);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,(allocator_type *)&local_68);
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__n,(allocator_type *)&local_70);
  if (0 < iVar1) {
    piVar3 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (pMVar2->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar9] = piVar4[piVar3[sVar9]];
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar9] = piVar4[(long)piVar3[sVar9] + 1];
      sVar9 = sVar9 + 1;
    } while (__n != sVar9);
  }
  do {
    uVar6 = LuUpdate::Factorize((this->lu_)._M_t.
                                super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                                .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,
                                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (pMVar2->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (pMVar2->AI_).values_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,false);
    this->num_factorizations_ = this->num_factorizations_ + 1;
    local_70 = LuUpdate::fill_factor
                         ((this->lu_)._M_t.
                          super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                          .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
    __position._M_current =
         (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->fill_factors_,__position,&local_70);
    }
    else {
      *__position._M_current = local_70;
      (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if ((uVar6 & 2) != 0) {
      IVar8 = 0x12d;
      AdaptToSingularFactorization(this);
      goto LAB_0038d5c5;
    }
    IVar8 = 0;
    if ((uVar6 & 1) == 0) goto LAB_0038d5c5;
    bVar5 = TightenLuPivotTol(this);
  } while (bVar5);
  poVar7 = Control::Debug(this->control_,3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," LU factorization unstable with pivot tolerance ",0x30);
  dVar10 = LuUpdate::pivottol((this->lu_)._M_t.
                              super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                              .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
  poVar7 = std::ostream::_M_insert<double>(dVar10);
  local_70 = (double)CONCAT71(local_70._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_70,1);
  IVar8 = 0;
LAB_0038d5c5:
  dVar10 = Timer::Elapsed(&local_50);
  this->time_factorize_ = dVar10 + this->time_factorize_;
  this->factorization_is_fresh_ = true;
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return IVar8;
}

Assistant:

Int Basis::Factorize() {
    const Int m = model_.rows();
    const SparseMatrix& AI = model_.AI();
    Timer timer;

    // Build column pointers for passing to LU factorization.
    std::vector<Int> begin(m), end(m);
    for (Int i = 0; i < m; i++) {
        assert(basis_[i] >= 0);
        begin[i] = AI.begin(basis_[i]);
        end[i] = AI.end(basis_[i]);
    }

    Int err = 0;                // return code
    while (true) {
        Int flag = lu_->Factorize(begin.data(), end.data(), AI.rowidx(),
                                  AI.values(), false);
        num_factorizations_++;
        fill_factors_.push_back(lu_->fill_factor());
        if (flag & 2) {
            AdaptToSingularFactorization();
            err = IPX_ERROR_basis_singular;
            break;
        }
        if ((flag & 1) && TightenLuPivotTol()) {
            // The factorization was numerically unstable and the pivot
            // tolerance could be tightened. Repeat.
            continue;
        }
        if (flag & 1) {
            control_.Debug(3)
                << " LU factorization unstable with pivot tolerance "
                << lu_->pivottol() << '\n';
            // ignore instability
        }
        break;
    }
    time_factorize_ += timer.Elapsed();
    factorization_is_fresh_ = true;
    return err;
}